

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void or(ch_compilation *comp)

{
  ch_emit_scope *pcVar1;
  ch_jmpptr patch_at;
  ch_jmpptr patch_at_00;
  ch_op op;
  undefined1 local_24 [4];
  
  patch_at = emit_jump(comp,OP_JMP_FALSE);
  patch_at_00 = emit_jump(comp,OP_JMP);
  pcVar1 = (comp->emit).emit_scope;
  ch_emit_patch_ptr(&comp->emit,
                    (*(int *)&(pcVar1->bytecode).current -
                    (*(int *)&(pcVar1->bytecode).start + patch_at)) - 4,patch_at);
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,local_24,1);
  parse(comp,PREC_OR);
  pcVar1 = (comp->emit).emit_scope;
  ch_emit_patch_ptr(&comp->emit,
                    (*(int *)&(pcVar1->bytecode).current -
                    (*(int *)&(pcVar1->bytecode).start + patch_at_00)) - 4,patch_at_00);
  return;
}

Assistant:

void or(ch_compilation* comp) {
  ch_dataptr patch_false = emit_jump(comp, OP_JMP_FALSE);  
  ch_dataptr patch_true = emit_jump(comp, OP_JMP); // If true, no need to evaluate the next expression
  patch_jump(comp, patch_false);
  EMIT_OP(GET_EMIT(comp), OP_POP);
  parse(comp, PREC_OR);
  patch_jump(comp, patch_true);
}